

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

void avro::compileJsonSchema(istream *is,ValidSchema *schema)

{
  element_type *peVar1;
  shared_count sVar2;
  undefined8 *puVar3;
  element_type *local_58;
  shared_count sStack_50;
  undefined1 local_48 [16];
  element_type *local_38;
  shared_count asStack_30 [2];
  
  if (*(int *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) == 0) {
    istreamInputStream((avro *)&local_58,is,0x2000);
    compileJsonSchemaFromStream((avro *)&local_38,(InputStream *)local_58);
    if (local_58 != (element_type *)0x0) {
      (*local_58->_vptr_Node[1])();
    }
    sVar2.pi_ = asStack_30[0].pi_;
    peVar1 = local_38;
    local_38 = (element_type *)0x0;
    asStack_30[0].pi_ = (sp_counted_base *)0x0;
    local_58 = (schema->root_).px;
    sStack_50.pi_ = (schema->root_).pn.pi_;
    (schema->root_).px = peVar1;
    (schema->root_).pn.pi_ = sVar2.pi_;
    boost::detail::shared_count::~shared_count(&sStack_50);
    boost::detail::shared_count::~shared_count(asStack_30);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_58 = (element_type *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Input stream is not good","")
  ;
  std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)&local_58);
  *puVar3 = 0x1cc910;
  puVar3[1] = 0x1cc940;
  __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

AVRO_DECL void compileJsonSchema(std::istream &is, ValidSchema &schema)
{
    if (!is.good()) {
        throw Exception("Input stream is not good");
    }

    schema = compile(is);
}